

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

Extension * __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewRepeatedExtension
          (ExtensionSet *this,FieldDescriptor *descriptor)

{
  byte *pbVar1;
  byte bVar2;
  Arena *this_00;
  FieldDescriptor *pFVar3;
  bool bVar4;
  undefined8 *puVar5;
  Extension *extension;
  FieldDescriptor *local_28 [3];
  
  bVar4 = MaybeNewExtension(this,descriptor->number_,descriptor,(Extension **)local_28);
  pFVar3 = local_28[0];
  if (bVar4) {
    bVar2 = descriptor->type_;
    *(byte *)&(local_28[0]->all_names_).payload_ = bVar2;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar2 * 4) != 10) {
      MaybeNewRepeatedExtension();
      descriptor = pFVar3;
      goto LAB_0049044e;
    }
    *(bool *)((long)&(local_28[0]->all_names_).payload_ + 1) = true;
    pbVar1 = (byte *)((long)&(local_28[0]->all_names_).payload_ + 2);
    *pbVar1 = *pbVar1 | 1;
    this_00 = this->arena_;
    descriptor = local_28[0];
    if (this_00 != (Arena *)0x0) {
      puVar5 = (undefined8 *)Arena::Allocate(this_00,0x18);
      *puVar5 = 0;
      puVar5[1] = 0;
      puVar5[2] = this_00;
      descriptor = local_28[0];
      goto LAB_00490416;
    }
  }
  else {
    if (*(bool *)((long)&(local_28[0]->all_names_).payload_ + 1) == true) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                  (ulong)*(byte *)&(local_28[0]->all_names_).payload_ * 4) == 10) {
        return (Extension *)local_28[0];
      }
      MaybeNewRepeatedExtension();
    }
LAB_0049044e:
    MaybeNewRepeatedExtension((ExtensionSet *)(local_28 + 1));
  }
  puVar5 = (undefined8 *)operator_new(0x18);
  *puVar5 = 0;
  puVar5[1] = 0;
  puVar5[2] = 0;
LAB_00490416:
  *(undefined8 **)descriptor = puVar5;
  return (Extension *)local_28[0];
}

Assistant:

ExtensionSet::Extension* ExtensionSet::MaybeNewRepeatedExtension(
    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    ABSL_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }
  return extension;
}